

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_impl.cpp
# Opt level: O1

MPP_RET mpp_ops_enc_get_pkt(MppDump info,MppPacket pkt)

{
  pthread_mutex_t *__mutex;
  size_t sVar1;
  void *__ptr;
  MppDumpImpl *p;
  
  if (pkt != (MppPacket)0x0 && info != (MppDump)0x0) {
    sVar1 = mpp_packet_get_length(pkt);
    __mutex = *info;
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_lock(__mutex);
    }
    if (*(long *)((long)info + 0x30) != 0) {
      __ptr = mpp_packet_get_data(pkt);
      fwrite(__ptr,1,sVar1 & 0xffffffff,*(FILE **)((long)info + 0x30));
      fflush(*(FILE **)((long)info + 0x30));
    }
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_unlock(__mutex);
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_ops_enc_get_pkt(MppDump info, MppPacket pkt)
{
    MppDumpImpl *p = (MppDumpImpl *)info;
    if (NULL == p || NULL == pkt)
        return MPP_OK;

    RK_U32 length = mpp_packet_get_length(pkt);
    AutoMutex auto_lock(p->lock);

    if (p->fp_out) {
        fwrite(mpp_packet_get_data(pkt), 1, length, p->fp_out);
        fflush(p->fp_out);
    }

    return MPP_OK;
}